

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ObjSetPhase(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  bool local_32;
  bool local_31;
  int fPhase2;
  int fPhase1;
  int fPhase0;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsCo(pObj);
    if (iVar1 == 0) {
      *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff;
    }
    else {
      pGVar6 = Gia_ObjFanin0(pObj);
      uVar3 = Gia_ObjPhase(pGVar6);
      uVar2 = Gia_ObjFaninC0(pObj);
      *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | (ulong)(uVar3 ^ uVar2) << 0x3f;
    }
  }
  else {
    pGVar6 = Gia_ObjFanin0(pObj);
    uVar2 = Gia_ObjPhase(pGVar6);
    uVar3 = Gia_ObjFaninC0(pObj);
    uVar2 = uVar2 ^ uVar3;
    pGVar6 = Gia_ObjFanin1(pObj);
    uVar4 = Gia_ObjPhase(pGVar6);
    uVar3 = Gia_ObjFaninC1(pObj);
    uVar4 = uVar4 ^ uVar3;
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsXor(pObj);
      if (iVar1 == 0) {
        *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | (ulong)(uVar2 & uVar4) << 0x3f;
      }
      else {
        *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | (ulong)(uVar2 ^ uVar4) << 0x3f;
      }
    }
    else {
      pGVar6 = Gia_ObjFanin2(p,pObj);
      uVar3 = Gia_ObjPhase(pGVar6);
      uVar5 = Gia_ObjFaninC2(p,pObj);
      if (((uVar3 ^ uVar5) == 0) || (local_31 = true, uVar4 == 0)) {
        local_32 = (uVar3 ^ uVar5) == 0 && uVar2 != 0;
        local_31 = local_32;
      }
      *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | (ulong)local_31 << 0x3f;
    }
  }
  return;
}

Assistant:

void Gia_ObjSetPhase( Gia_Man_t * p, Gia_Obj_t * pObj )  
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fPhase0 = Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj);
        int fPhase1 = Gia_ObjPhase(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(pObj);
        if ( Gia_ObjIsMux(p, pObj) )
        {
            int fPhase2 = Gia_ObjPhase(Gia_ObjFanin2(p, pObj)) ^ Gia_ObjFaninC2(p, pObj);
            pObj->fPhase = (fPhase2 && fPhase1) || (!fPhase2 && fPhase0);
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->fPhase = fPhase0 ^ fPhase1;
        else
            pObj->fPhase = fPhase0 & fPhase1;
    }
    else if ( Gia_ObjIsCo(pObj) )
        pObj->fPhase = (Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj));
    else
        pObj->fPhase = 0;
}